

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

int __thiscall
QSocks5SocketEngine::bind(QSocks5SocketEngine *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  QLatin1StringView latin1;
  QDeadlineTimer deadline;
  bool bVar1;
  quint16 qVar2;
  quint16 qVar3;
  NetworkLayerProtocol NVar4;
  SocketType SVar5;
  SocketState SVar6;
  QSocks5SocketEnginePrivate *pQVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  undefined8 uVar9;
  long in_FS_OFFSET;
  QSocks5SocketEnginePrivate *d;
  QHostAddress address;
  undefined4 in_stack_fffffffffffffee8;
  BindFlag in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  QAbstractSocket *in_stack_fffffffffffffef8;
  SocketError SVar10;
  duration<long,_std::ratio<1L,_1L>_> remaining;
  undefined6 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff06;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  quint16 in_stack_ffffffffffffff26;
  quint16 qVar11;
  undefined6 in_stack_ffffffffffffff40;
  Socks5Mode in_stack_ffffffffffffff5c;
  undefined1 uVar12;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffff60;
  undefined4 local_54;
  undefined1 local_50 [60];
  undefined4 local_14;
  undefined8 local_10;
  long local_8;
  
  uVar9 = CONCAT44(in_register_00000034,__fd);
  qVar11 = (quint16)__addr;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QSocks5SocketEngine *)0x37325d);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress
            ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  NVar4 = QHostAddress::protocol((QHostAddress *)0x373288);
  if (NVar4 == AnyIPProtocol) {
    QHostAddress::operator=
              ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec);
  }
  else {
    QHostAddress::operator=
              ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (QHostAddress *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  if (pQVar7->data == (QSocks5Data *)0x0) {
    SVar5 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)0x3732cc);
    if (SVar5 == TcpSocket) {
      QSocks5SocketEnginePrivate::initialize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    else {
      SVar5 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)0x3732ec);
      if (SVar5 != UdpSocket) {
        uVar12 = 0;
        goto LAB_003736ed;
      }
      QSocks5SocketEnginePrivate::initialize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
  }
  if (pQVar7->mode == UdpAssociateMode) {
    in_stack_ffffffffffffff18 = (QSocks5SocketEnginePrivate *)pQVar7->udpData->udpSocket;
    qVar3 = qVar11;
    QFlags<QAbstractSocket::BindFlag>::QFlags
              ((QFlags<QAbstractSocket::BindFlag> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec);
    uVar8 = (**(code **)(*(long *)&in_stack_ffffffffffffff18->super_QAbstractSocketEnginePrivate +
                        0xf0))(in_stack_ffffffffffffff18,&local_10,qVar11,local_14);
    if ((uVar8 & 1) == 0) {
      QAbstractSocket::error((QAbstractSocket *)0x373396);
      SVar10 = (SocketError)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      QIODevice::errorString();
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)
                 CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00),SVar10,
                 (QString *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      QString::~QString((QString *)0x3733da);
      uVar12 = 0;
      goto LAB_003736ed;
    }
    QAbstractSocket::localAddress(in_stack_fffffffffffffef8);
    QHostAddress::operator=
              ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (QHostAddress *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QHostAddress::~QHostAddress((QHostAddress *)0x37342f);
    qVar2 = QAbstractSocket::localPort
                      ((QAbstractSocket *)
                       CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    (pQVar7->super_QAbstractSocketEnginePrivate).localPort = qVar2;
    in_stack_ffffffffffffff26 = qVar11;
    qVar11 = qVar3;
  }
  else {
    if (pQVar7->mode != BindMode) {
      uVar12 = 0;
      goto LAB_003736ed;
    }
    QHostAddress::operator=
              ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (QHostAddress *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    (pQVar7->super_QAbstractSocketEnginePrivate).localPort = qVar11;
  }
  remaining.__r = (rep)pQVar7->data->controlSocket;
  QNetworkProxy::hostName((QNetworkProxy *)remaining.__r);
  qVar3 = QNetworkProxy::port((QNetworkProxy *)
                              CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffeec
            );
  (**(code **)((long)*(totally_ordered_wrapper<QNetworkProxyPrivate_*> *)
                      &((QTcpSocket *)remaining.__r)->super_QAbstractSocket + 0xf8))
            (remaining.__r,local_50,qVar3,local_54,2);
  QString::~QString((QString *)0x373530);
  QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1l>>
            ((QDeadlineTimer *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             remaining,PreciseTimer);
  deadline.t1._6_2_ = qVar11;
  deadline.t1._0_6_ = in_stack_ffffffffffffff40;
  deadline.t2 = (int)uVar9;
  deadline.type = (int)((ulong)uVar9 >> 0x20);
  bVar1 = QSocks5SocketEnginePrivate::waitForConnected
                    (in_stack_ffffffffffffff18,deadline,
                     (bool *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if ((bVar1) &&
     (SVar6 = QAbstractSocket::state((QAbstractSocket *)0x37359b), SVar6 != UnconnectedState)) {
    if (pQVar7->socks5State == BindSuccess) {
      QAbstractSocketEngine::setState
                ((QAbstractSocketEngine *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec);
      uVar12 = 1;
    }
    else if (pQVar7->socks5State == UdpAssociateSuccess) {
      QAbstractSocketEngine::setState
                ((QAbstractSocketEngine *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec);
      QHostAddress::operator=
                ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (QHostAddress *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      QHostAddress::QHostAddress
                ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      QHostAddress::operator=
                ((QHostAddress *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (QHostAddress *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      QHostAddress::~QHostAddress((QHostAddress *)0x373656);
      pQVar7->udpData->associatePort = (pQVar7->super_QAbstractSocketEnginePrivate).localPort;
      (pQVar7->super_QAbstractSocketEnginePrivate).localPort = 0;
      uVar12 = 1;
    }
    else {
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT26(qVar3,in_stack_ffffffffffffff00),(char *)remaining.__r);
      SVar10 = (SocketError)((ulong)remaining.__r >> 0x20);
      latin1.m_size._6_2_ = in_stack_ffffffffffffff26;
      latin1.m_size._0_6_ = in_stack_ffffffffffffff20;
      latin1.m_data = (char *)this;
      QString::QString((QString *)CONCAT26(qVar3,in_stack_ffffffffffffff00),latin1);
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)CONCAT26(qVar3,in_stack_ffffffffffffff00),SVar10,
                 (QString *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      QString::~QString((QString *)0x3736e0);
      uVar12 = 0;
    }
  }
  else {
    uVar12 = 0;
  }
LAB_003736ed:
  QHostAddress::~QHostAddress((QHostAddress *)0x3736fa);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),uVar12) & 0xffffff01;
}

Assistant:

bool QSocks5SocketEngine::bind(const QHostAddress &addr, quint16 port)
{
    Q_D(QSocks5SocketEngine);

    // when bind we will block until the bind is finished as the info from the proxy server is needed

    QHostAddress address;
    if (addr.protocol() == QAbstractSocket::AnyIPProtocol)
        address = QHostAddress::AnyIPv4; //SOCKS5 doesn't support dual stack, and there isn't any implementation of udp on ipv6 yet
    else
        address = addr;

    if (!d->data) {
        if (socketType() == QAbstractSocket::TcpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::BindMode);
#ifndef QT_NO_UDPSOCKET
        } else if (socketType() == QAbstractSocket::UdpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
#endif
        } else {
            //### something invalid
            return false;
        }
    }

#ifndef QT_NO_UDPSOCKET
    if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        if (!d->udpData->udpSocket->bind(address, port)) {
            QSOCKS5_Q_DEBUG << "local udp bind failed";
            setError(d->udpData->udpSocket->error(), d->udpData->udpSocket->errorString());
            return false;
        }
        d->localAddress = d->udpData->udpSocket->localAddress();
        d->localPort = d->udpData->udpSocket->localPort();
    } else
#endif
    if (d->mode == QSocks5SocketEnginePrivate::BindMode) {
        d->localAddress = address;
        d->localPort = port;
    } else {
        //### something invalid
        return false;
    }

    d->data->controlSocket->connectToHost(d->proxyInfo.hostName(), d->proxyInfo.port());
    if (!d->waitForConnected(QDeadlineTimer{Socks5BlockingBindTimeout}, nullptr) ||
        d->data->controlSocket->state() == QAbstractSocket::UnconnectedState) {
        // waitForConnected sets the error state and closes the socket
        QSOCKS5_Q_DEBUG << "waitForConnected to proxy server" << d->data->controlSocket->errorString();
        return false;
    }
    if (d->socks5State == QSocks5SocketEnginePrivate::BindSuccess) {
        setState(QAbstractSocket::BoundState);
        return true;
#ifndef QT_NO_UDPSOCKET
    } else if (d->socks5State == QSocks5SocketEnginePrivate::UdpAssociateSuccess) {
        setState(QAbstractSocket::BoundState);
        d->udpData->associateAddress = d->localAddress;
        d->localAddress = QHostAddress();
        d->udpData->associatePort = d->localPort;
        d->localPort = 0;
        return true;
#endif // QT_NO_UDPSOCKET
    }

    // binding timed out
    setError(QAbstractSocket::SocketTimeoutError,
             QLatin1StringView(QT_TRANSLATE_NOOP("QSocks5SocketEngine", "Network operation timed out")));

///###    delete d->udpSocket;
///###    d->udpSocket = 0;
    return false;
}